

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZEncoder.cpp
# Opt level: O3

EncodeResult *
ZXing::Aztec::Encoder::Encode
          (EncodeResult *__return_storage_ptr__,string *data,int minECCPercent,
          int userSpecifiedLayers)

{
  pointer piVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  int iVar7;
  invalid_argument *piVar8;
  pointer puVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  pointer puVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vector<int,_std::allocator<int>_> alignmentMap;
  BitArray stuffedBits;
  BitArray messageBits;
  BitArray bits;
  string local_148;
  allocator_type local_121;
  ulong local_120;
  vector<int,_std::allocator<int>_> local_118;
  uint local_fc;
  undefined1 local_f8 [16];
  pointer local_e8;
  long local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  BitMatrix *local_98;
  ulong local_90;
  BitArray local_88;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  value_type_conflict3 local_34;
  
  HighLevelEncoder::Encode(&local_88,data);
  local_88._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (int)local_88._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish -
       (int)local_88._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start;
  iVar14 = minECCPercent *
           (int)local_88._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  iVar11 = iVar14 >> 0x1f;
  iVar14 = iVar14 / 100 + iVar11;
  local_e0 = CONCAT44(local_e0._4_4_,(iVar14 - iVar11) + 0xb);
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (pointer)0x0;
  if (userSpecifiedLayers == 0) {
    puVar9 = (pointer)0x0;
    puVar16 = (pointer)0x0;
    iVar21 = 0;
    uVar15 = 0;
    do {
      uVar18 = uVar15 + 1;
      uVar24 = uVar15;
      if (uVar15 < 4) {
        uVar24 = uVar18;
      }
      uVar25 = (ulong)uVar24;
      bVar26 = uVar15 < 4;
      iVar23 = uVar24 * 0x10 + 0x70;
      if (bVar26) {
        iVar23 = uVar24 * 0x10 + 0x58;
      }
      iVar23 = iVar23 * uVar24;
      if ((int)local_88._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish + (iVar14 - iVar11) + 0xb <= iVar23) {
        iVar7 = *(int *)(WORD_SIZE + uVar25 * 4);
        local_120 = uVar25;
        if (iVar21 != iVar7) {
          StuffBits(&local_88,iVar7,(BitArray *)local_f8);
          puVar9 = (pointer)local_f8._0_8_;
          puVar16 = (pointer)local_f8._8_8_;
          iVar21 = iVar7;
        }
        iVar7 = (int)puVar16 - (int)puVar9;
        if ((3 < uVar15 || iVar7 <= iVar21 * 0x40) &&
           (iVar7 + (int)local_e0 <= iVar23 - iVar23 % iVar21)) goto LAB_00149a87;
      }
      uVar15 = uVar18;
      if (uVar18 == 0x21) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"Data too large for an Aztec code");
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    } while( true );
  }
  uVar15 = -userSpecifiedLayers;
  if (0 < userSpecifiedLayers) {
    uVar15 = userSpecifiedLayers;
  }
  uVar25 = (ulong)uVar15;
  uVar24 = 0x20;
  if (userSpecifiedLayers < 0) {
    uVar24 = 4;
  }
  if (uVar24 < uVar15) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_148,userSpecifiedLayers);
    std::operator+(&local_d8,"Illegal value for layers: ",&local_148);
    std::invalid_argument::invalid_argument(piVar8,(string *)&local_d8);
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar23 = uVar15 * 0x10 + 0x58;
  if (-1 < userSpecifiedLayers) {
    iVar23 = uVar15 * 0x10 + 0x70;
  }
  iVar21 = *(int *)(WORD_SIZE + uVar25 * 4);
  StuffBits(&local_88,iVar21,(BitArray *)local_f8);
  iVar23 = iVar23 * uVar15;
  local_120 = uVar25;
  if ((int)local_e0 + (local_f8._8_4_ - local_f8._0_4_) <= iVar23 - iVar23 % iVar21) {
    if (userSpecifiedLayers < 0) {
      bVar26 = true;
      if (iVar21 * 0x40 < (int)(local_f8._8_4_ - local_f8._0_4_)) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"Data to large for user specified layer");
        goto LAB_0014a652;
      }
    }
    else {
      bVar26 = false;
    }
LAB_00149a87:
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    GenerateCheckWords((BitArray *)local_f8,iVar23,iVar21,(BitArray *)&local_d8);
    iVar21 = (int)(local_f8._8_4_ - local_f8._0_4_) / iVar21;
    uVar15 = (int)local_120 - 1;
    local_148._M_dataplus._M_p = (pointer)0x0;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity = 0;
    if (bVar26 == false) {
      uVar24 = 4;
      do {
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = (uVar15 >> (uVar24 & 0x1f) & 1) != 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,
                   (uchar *)&local_118);
        bVar27 = uVar24 != 0;
        uVar24 = uVar24 - 1;
      } while (bVar27);
      uVar15 = 10;
      do {
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = (iVar21 - 1U >> (uVar15 & 0x1f) & 1) != 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,
                   (uchar *)&local_118);
        bVar27 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar27);
      iVar14 = 0x28;
    }
    else {
      uVar24 = 1;
      do {
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = (uVar15 >> (uVar24 & 0x1f) & 1) != 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,
                   (uchar *)&local_118);
        bVar27 = uVar24 != 0;
        uVar24 = uVar24 - 1;
      } while (bVar27);
      uVar15 = 5;
      do {
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = (iVar21 - 1U >> (uVar15 & 0x1f) & 1) != 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,
                   (uchar *)&local_118);
        bVar27 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar27);
      iVar14 = 0x1c;
    }
    GenerateCheckWords((BitArray *)&local_148,iVar14,4,(BitArray *)&local_148);
    bVar6 = bVar26 ^ 1;
    uVar15 = (uint)bVar6 + (uint)bVar6 * 2 + (int)local_120 * 4 + 0xb;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_118,(long)(int)uVar15,&local_34,&local_121);
    uVar25 = local_120;
    auVar5 = _DAT_001921f0;
    auVar4 = _DAT_001921e0;
    auVar3 = _DAT_001921d0;
    if (bVar26 == false) {
      uVar24 = (int)uVar15 / 2;
      iVar14 = (int)((ulong)((long)(int)(uVar24 - 1) * -0x77777777) >> 0x20) + uVar24 + -1;
      iVar14 = (iVar14 >> 3) - (iVar14 >> 0x1f);
      local_fc = uVar15 + iVar14 * 2 + 1;
      if (1 < (int)uVar15) {
        iVar11 = (int)(((uVar15 + iVar14 * 2) - ((int)local_fc >> 0x1f)) + 1) >> 1;
        lVar13 = (ulong)uVar24 * 4 +
                 CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._1_7_,
                          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_1_);
        iVar14 = iVar11 + 1;
        lVar22 = -4;
        uVar10 = 0;
        do {
          iVar11 = iVar11 + -1;
          iVar23 = (int)((uVar10 & 0xffffffff) / 0xf);
          *(int *)(lVar13 + lVar22) = iVar11 - iVar23;
          *(int *)(lVar13 + uVar10 * 4) = (int)uVar10 + iVar14 + iVar23;
          uVar10 = uVar10 + 1;
          lVar22 = lVar22 + -4;
        } while (uVar24 != uVar10);
      }
    }
    else {
      piVar1 = (pointer)CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._1_7_,
                                 local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_1_);
      local_fc = uVar15;
      if (piVar1 != local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        uVar10 = (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + (-4 - (long)piVar1);
        auVar30._8_4_ = (int)uVar10;
        auVar30._0_8_ = uVar10;
        auVar30._12_4_ = (int)(uVar10 >> 0x20);
        auVar28._0_8_ = uVar10 >> 2;
        auVar28._8_8_ = auVar30._8_8_ >> 2;
        uVar12 = 0;
        auVar28 = auVar28 ^ _DAT_001921f0;
        do {
          iVar11 = (int)uVar12;
          auVar29._8_4_ = iVar11;
          auVar29._0_8_ = uVar12;
          auVar29._12_4_ = (int)(uVar12 >> 0x20);
          auVar30 = (auVar29 | auVar4) ^ auVar5;
          iVar14 = auVar28._4_4_;
          if ((bool)(~(auVar30._4_4_ == iVar14 && auVar28._0_4_ < auVar30._0_4_ ||
                      iVar14 < auVar30._4_4_) & 1)) {
            piVar1[uVar12] = iVar11;
          }
          if ((auVar30._12_4_ != auVar28._12_4_ || auVar30._8_4_ <= auVar28._8_4_) &&
              auVar30._12_4_ <= auVar28._12_4_) {
            piVar1[uVar12 + 1] = iVar11 + 1;
          }
          auVar30 = (auVar29 | auVar3) ^ auVar5;
          iVar23 = auVar30._4_4_;
          if (iVar23 <= iVar14 && (iVar23 != iVar14 || auVar30._0_4_ <= auVar28._0_4_)) {
            piVar1[uVar12 + 2] = iVar11 + 2;
            piVar1[uVar12 + 3] = iVar11 + 3;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
    }
    __return_storage_ptr__->compact = bVar26;
    __return_storage_ptr__->size = local_fc;
    iVar14 = (int)local_120;
    __return_storage_ptr__->layers = iVar14;
    __return_storage_ptr__->codeWords = iVar21;
    local_98 = &__return_storage_ptr__->matrix;
    local_b0 = (ulong)uVar15;
    BitMatrix::BitMatrix(local_98,local_fc,local_fc);
    uVar15 = local_fc;
    local_60 = (long)iVar14;
    local_68 = (ulong)bVar6 * 3 + 9;
    local_70 = 1;
    if (1 < iVar14) {
      local_70 = uVar25 & 0xffffffff;
    }
    local_a8 = 0;
    uVar25 = 0;
    do {
      local_90 = uVar25;
      lVar13 = (local_60 - local_90) * 4;
      local_a0 = lVar13 + local_68;
      iVar14 = (int)local_b0;
      if (local_a0 != 0 && SCARRY8(lVar13,local_68) == local_a0 < 0) {
        uVar25 = local_90 * 2;
        local_40 = (long)(int)local_a8;
        local_48 = local_40 + local_a0 * 2;
        iVar11 = ~(uint)uVar25 + (int)local_b0;
        local_50 = local_40 + local_a0 * 4;
        local_58 = local_40 + local_a0 * 6;
        local_120 = CONCAT44(local_120._4_4_,iVar11);
        lVar13 = 0;
        do {
          local_e0 = lVar13;
          uVar10 = 0;
          bVar27 = true;
          do {
            bVar20 = bVar27;
            uVar17 = uVar10 | local_40 + local_e0 * 2;
            uVar12 = local_d8._M_string_length - (long)local_d8._M_dataplus._M_p;
            if (uVar12 <= uVar17) {
LAB_0014a583:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            if (local_d8._M_dataplus._M_p[uVar17] != '\0') {
              uVar12 = (long)(__return_storage_ptr__->matrix)._width *
                       (long)*(int *)(CONCAT71(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._1_7_,
                                               local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_1_) +
                                     (local_e0 + uVar25) * 4) +
                       (long)*(int *)(CONCAT71(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._1_7_,
                                               local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_1_) +
                                     (uVar10 | uVar25) * 4);
              puVar9 = (__return_storage_ptr__->matrix)._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
              goto LAB_0014a583;
              puVar9[uVar12] = 0xff;
              uVar12 = local_d8._M_string_length - (long)local_d8._M_dataplus._M_p;
            }
            uVar17 = local_48 + local_e0 * 2 | uVar10;
            if (uVar12 <= uVar17) goto LAB_0014a583;
            if (local_d8._M_dataplus._M_p[uVar17] != '\0') {
              uVar12 = (long)(__return_storage_ptr__->matrix)._width *
                       (long)*(int *)(CONCAT71(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._1_7_,
                                               local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_1_) +
                                     (long)(iVar11 - (int)uVar10) * 4) +
                       (long)*(int *)(CONCAT71(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._1_7_,
                                               local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_1_) +
                                     (local_e0 + uVar25) * 4);
              puVar9 = (__return_storage_ptr__->matrix)._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
              goto LAB_0014a583;
              puVar9[uVar12] = 0xff;
              uVar12 = local_d8._M_string_length - (long)local_d8._M_dataplus._M_p;
            }
            uVar17 = local_50 + local_e0 * 2 | uVar10;
            if (uVar12 <= uVar17) goto LAB_0014a583;
            if (local_d8._M_dataplus._M_p[uVar17] != '\0') {
              uVar12 = (long)(__return_storage_ptr__->matrix)._width *
                       (long)*(int *)(CONCAT71(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._1_7_,
                                               local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_1_) +
                                     (iVar11 - local_e0) * 4) +
                       (long)*(int *)(CONCAT71(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._1_7_,
                                               local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_1_) +
                                     ((long)iVar11 - uVar10) * 4);
              puVar9 = (__return_storage_ptr__->matrix)._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
              goto LAB_0014a583;
              puVar9[uVar12] = 0xff;
              uVar12 = local_d8._M_string_length - (long)local_d8._M_dataplus._M_p;
            }
            uVar17 = local_58 + local_e0 * 2 | uVar10;
            if (uVar12 <= uVar17) goto LAB_0014a583;
            if (local_d8._M_dataplus._M_p[uVar17] != '\0') {
              uVar10 = (long)(__return_storage_ptr__->matrix)._width *
                       (long)*(int *)(CONCAT71(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._1_7_,
                                               local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_1_) +
                                     (uVar10 | uVar25) * 4) +
                       (long)*(int *)(CONCAT71(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._1_7_,
                                               local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_1_) +
                                     (long)(iVar11 - (int)local_e0) * 4);
              puVar9 = (__return_storage_ptr__->matrix)._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar10)
              goto LAB_0014a583;
              puVar9[uVar10] = 0xff;
            }
            uVar10 = 1;
            bVar27 = false;
          } while (bVar20);
          lVar13 = local_e0 + 1;
        } while (local_e0 + 1 < local_a0);
      }
      local_a8 = (ulong)(uint)((int)local_a8 + (int)local_a0 * 8);
      uVar25 = local_90 + 1;
    } while (local_90 + 1 != local_70);
    uVar24 = (int)local_fc / 2;
    if (bVar26 == false) {
      iVar11 = uVar24 - 5;
      uVar25 = 0x27;
      uVar10 = 0;
      do {
        uVar17 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        uVar12 = uVar10;
        if (uVar17 <= uVar10) goto LAB_0014a5ac;
        uVar18 = (uint)(4 < uVar10);
        iVar21 = (int)uVar10;
        if (local_148._M_dataplus._M_p[uVar10] != '\0') {
          uVar12 = (ulong)(int)((__return_storage_ptr__->matrix)._width * (uVar24 - 7) + uVar18 +
                                iVar11 + iVar21);
          puVar9 = (__return_storage_ptr__->matrix)._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
          goto LAB_0014a5ac;
          puVar9[uVar12] = 0xff;
          uVar17 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        }
        uVar12 = uVar10 + 10;
        if (uVar17 <= uVar10 + 10) goto LAB_0014a5ac;
        iVar23 = (uint)(4 < uVar10) + iVar11 + iVar21;
        if (local_148._M_dataplus._M_p[uVar10 + 10] != '\0') {
          uVar12 = (ulong)(int)((__return_storage_ptr__->matrix)._width * iVar23 + uVar24 + 7);
          puVar9 = (__return_storage_ptr__->matrix)._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
          goto LAB_0014a5ac;
          puVar9[uVar12] = 0xff;
          uVar17 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        }
        uVar12 = uVar25 - 10;
        if (uVar17 <= uVar25 - 10) goto LAB_0014a5ac;
        if (local_148._M_dataplus._M_p[uVar25 - 10] != '\0') {
          uVar12 = (ulong)(int)((__return_storage_ptr__->matrix)._width * (uVar24 + 7) + uVar18 +
                                iVar11 + iVar21);
          puVar9 = (__return_storage_ptr__->matrix)._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
          goto LAB_0014a5ac;
          puVar9[uVar12] = 0xff;
          uVar17 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        }
        uVar12 = uVar25;
        if (uVar17 <= uVar25) goto LAB_0014a5ac;
        if (local_148._M_dataplus._M_p[uVar25] != '\0') {
          uVar12 = (ulong)(int)(iVar23 * (__return_storage_ptr__->matrix)._width + (uVar24 - 7));
          puVar9 = (__return_storage_ptr__->matrix)._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
          goto LAB_0014a5ac;
          puVar9[uVar12] = 0xff;
        }
        uVar10 = uVar10 + 1;
        uVar25 = uVar25 - 1;
      } while (uVar10 != 10);
    }
    else {
      lVar13 = (long)(int)uVar24 + -3;
      uVar25 = 0x1b;
      uVar10 = 0;
      do {
        uVar17 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        uVar12 = uVar10;
        if (uVar17 <= uVar10) {
LAB_0014a5ac:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar12);
        }
        if (local_148._M_dataplus._M_p[uVar10] != '\0') {
          lVar22 = (long)(int)((__return_storage_ptr__->matrix)._width * (uVar24 - 5));
          uVar12 = lVar13 + uVar10 + lVar22;
          puVar9 = (__return_storage_ptr__->matrix)._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
          goto LAB_0014a5ac;
          puVar9[uVar10 + lVar13 + lVar22] = 0xff;
          uVar17 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        }
        uVar12 = uVar10 + 7;
        if (uVar17 <= uVar10 + 7) goto LAB_0014a5ac;
        if (local_148._M_dataplus._M_p[uVar10 + 7] != '\0') {
          uVar12 = (ulong)(int)(((int)lVar13 + (int)uVar10) *
                                (__return_storage_ptr__->matrix)._width + uVar24 + 5);
          puVar9 = (__return_storage_ptr__->matrix)._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
          goto LAB_0014a5ac;
          puVar9[uVar12] = 0xff;
          uVar17 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        }
        uVar12 = uVar25 - 7;
        if (uVar17 <= uVar25 - 7) goto LAB_0014a5ac;
        if (local_148._M_dataplus._M_p[uVar25 - 7] != '\0') {
          lVar22 = (long)(int)((__return_storage_ptr__->matrix)._width * (uVar24 + 5));
          uVar12 = lVar13 + uVar10 + lVar22;
          puVar9 = (__return_storage_ptr__->matrix)._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
          goto LAB_0014a5ac;
          puVar9[uVar10 + lVar13 + lVar22] = 0xff;
          uVar17 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        }
        uVar12 = uVar25;
        if (uVar17 <= uVar25) goto LAB_0014a5ac;
        if (local_148._M_dataplus._M_p[uVar25] != '\0') {
          uVar12 = (ulong)(int)(((int)lVar13 + (int)uVar10) *
                                (__return_storage_ptr__->matrix)._width + (uVar24 - 5));
          puVar9 = (__return_storage_ptr__->matrix)._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar12)
          goto LAB_0014a5ac;
          puVar9[uVar12] = 0xff;
        }
        uVar10 = uVar10 + 1;
        uVar25 = uVar25 - 1;
      } while (uVar10 != 7);
    }
    if (bVar26 == false) {
      DrawBullsEye(local_98,uVar24,7);
      if (3 < iVar14) {
        iVar11 = 0;
        iVar21 = 0;
        uVar18 = uVar24;
        uVar19 = uVar24;
        do {
          if ((int)(uVar24 & 1) < (int)uVar15) {
            uVar25 = (ulong)(uVar24 & 1);
            do {
              uVar10 = (ulong)(int)((__return_storage_ptr__->matrix)._width * (int)uVar25 +
                                   (uVar24 - iVar11));
              puVar9 = (__return_storage_ptr__->matrix)._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar10)
              {
LAB_0014a591:
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              puVar9[uVar10] = 0xff;
              uVar10 = (ulong)(int)((__return_storage_ptr__->matrix)._width * (int)uVar25 +
                                   iVar11 + uVar24);
              puVar9 = (__return_storage_ptr__->matrix)._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <= uVar10)
              goto LAB_0014a591;
              puVar9[uVar10] = 0xff;
              lVar13 = (long)(int)((__return_storage_ptr__->matrix)._width * uVar19);
              puVar9 = (__return_storage_ptr__->matrix)._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <=
                  uVar25 + lVar13) goto LAB_0014a591;
              puVar9[uVar25 + lVar13] = 0xff;
              lVar13 = (long)(int)((__return_storage_ptr__->matrix)._width * uVar18);
              puVar9 = (__return_storage_ptr__->matrix)._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) <=
                  uVar25 + lVar13) goto LAB_0014a591;
              puVar9[uVar25 + lVar13] = 0xff;
              uVar25 = uVar25 + 2;
              uVar15 = local_fc;
            } while ((int)uVar25 < (int)local_fc);
          }
          iVar21 = iVar21 + 0xf;
          iVar11 = iVar11 + 0x10;
          uVar19 = uVar19 - 0x10;
          uVar18 = uVar18 + 0x10;
        } while (iVar21 < iVar14 / 2 + -1);
      }
    }
    else {
      DrawBullsEye(local_98,uVar24,5);
    }
    pvVar2 = (void *)CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._1_7_,
                              local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_1_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
    }
    if ((pointer)local_148._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
    if ((pointer)local_d8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_d8._M_dataplus._M_p,
                      local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
    }
    if ((pointer)local_f8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_f8._0_8_,(long)local_e8 - local_f8._0_8_);
    }
    pvVar2 = (void *)CONCAT44(local_88._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_88._bits.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_88._bits.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2
                     );
    }
    return __return_storage_ptr__;
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar8,"Data to large for user specified layer");
LAB_0014a652:
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

EncodeResult
Encoder::Encode(const std::string& data, int minECCPercent, int userSpecifiedLayers)
{
	// High-level encode
	BitArray bits = HighLevelEncoder::Encode(data);

	// stuff bits and choose symbol size
	int eccBits = bits.size() * minECCPercent / 100 + 11;
	int totalSizeBits = bits.size() + eccBits;
	bool compact;
	int layers;
	int totalBitsInLayer;
	int wordSize;
	BitArray stuffedBits;
	if (userSpecifiedLayers != DEFAULT_AZTEC_LAYERS) {
		compact = userSpecifiedLayers < 0;
		layers = std::abs(userSpecifiedLayers);
		if (layers > (compact ? MAX_NB_BITS_COMPACT : MAX_NB_BITS)) {
			throw std::invalid_argument("Illegal value for layers: " + std::to_string(userSpecifiedLayers));
		}
		totalBitsInLayer = TotalBitsInLayer(layers, compact);
		wordSize = WORD_SIZE[layers];
		int usableBitsInLayers = totalBitsInLayer - (totalBitsInLayer % wordSize);
		StuffBits(bits, wordSize, stuffedBits);
		if (stuffedBits.size() + eccBits > usableBitsInLayers) {
			throw std::invalid_argument("Data to large for user specified layer");
		}
		if (compact && stuffedBits.size() > wordSize * 64) {
			// Compact format only allows 64 data words, though C4 can hold more words than that
			throw std::invalid_argument("Data to large for user specified layer");
		}
	}
	else {
		wordSize = 0;
		// We look at the possible table sizes in the order Compact1, Compact2, Compact3,
		// Compact4, Normal4,...  Normal(i) for i < 4 isn't typically used since Compact(i+1)
		// is the same size, but has more data.
		for (int i = 0; ; i++) {
			if (i > MAX_NB_BITS) {
				throw std::invalid_argument("Data too large for an Aztec code");
			}
			compact = i <= 3;
			layers = compact ? i + 1 : i;
			totalBitsInLayer = TotalBitsInLayer(layers, compact);
			if (totalSizeBits > totalBitsInLayer) {
				continue;
			}
			// [Re]stuff the bits if this is the first opportunity, or if the
			// wordSize has changed
			if (wordSize != WORD_SIZE[layers]) {
				wordSize = WORD_SIZE[layers];
				StuffBits(bits, wordSize, stuffedBits);
			}
			int usableBitsInLayers = totalBitsInLayer - (totalBitsInLayer % wordSize);
			if (compact && stuffedBits.size() > wordSize * 64) {
				// Compact format only allows 64 data words, though C4 can hold more words than that
				continue;
			}
			if (stuffedBits.size() + eccBits <= usableBitsInLayers) {
				break;
			}
		}
	}
	BitArray messageBits;
	GenerateCheckWords(stuffedBits, totalBitsInLayer, wordSize, messageBits);

	// generate mode message
	int messageSizeInWords = stuffedBits.size() / wordSize;
	BitArray modeMessage;
	GenerateModeMessage(compact, layers, messageSizeInWords, modeMessage);

	// allocate symbol
	int baseMatrixSize = (compact ? 11 : 14) + layers * 4; // not including alignment lines
	std::vector<int> alignmentMap(baseMatrixSize, 0);
	int matrixSize;
	if (compact) {
		// no alignment marks in compact mode, alignmentMap is a no-op
		matrixSize = baseMatrixSize;
		std::iota(alignmentMap.begin(), alignmentMap.end(), 0);
	}
	else {
		matrixSize = baseMatrixSize + 1 + 2 * ((baseMatrixSize / 2 - 1) / 15);
		int origCenter = baseMatrixSize / 2;
		int center = matrixSize / 2;
		for (int i = 0; i < origCenter; i++) {
			int newOffset = i + i / 15;
			alignmentMap[origCenter - i - 1] = center - newOffset - 1;
			alignmentMap[origCenter + i] = center + newOffset + 1;
		}
	}

	EncodeResult output{compact, matrixSize, layers, messageSizeInWords, BitMatrix(matrixSize)};

	BitMatrix& matrix = output.matrix;

	// draw data bits
	for (int i = 0, rowOffset = 0; i < layers; i++) {
		int rowSize = (layers - i) * 4 + (compact ? 9 : 12);
		for (int j = 0; j < rowSize; j++) {
			int columnOffset = j * 2;
			for (int k = 0; k < 2; k++) {
				if (messageBits.get(rowOffset + columnOffset + k)) {
					matrix.set(alignmentMap[i * 2 + k], alignmentMap[i * 2 + j]);
				}
				if (messageBits.get(rowOffset + rowSize * 2 + columnOffset + k)) {
					matrix.set(alignmentMap[i * 2 + j], alignmentMap[baseMatrixSize - 1 - i * 2 - k]);
				}
				if (messageBits.get(rowOffset + rowSize * 4 + columnOffset + k)) {
					matrix.set(alignmentMap[baseMatrixSize - 1 - i * 2 - k], alignmentMap[baseMatrixSize - 1 - i * 2 - j]);
				}
				if (messageBits.get(rowOffset + rowSize * 6 + columnOffset + k)) {
					matrix.set(alignmentMap[baseMatrixSize - 1 - i * 2 - j], alignmentMap[i * 2 + k]);
				}
			}
		}
		rowOffset += rowSize * 8;
	}

	// draw mode message
	DrawModeMessage(matrix, compact, matrixSize, modeMessage);

	// draw alignment marks
	if (compact) {
		DrawBullsEye(matrix, matrixSize / 2, 5);
	}
	else {
		DrawBullsEye(matrix, matrixSize / 2, 7);
		for (int i = 0, j = 0; i < baseMatrixSize / 2 - 1; i += 15, j += 16) {
			for (int k = (matrixSize / 2) & 1; k < matrixSize; k += 2) {
				matrix.set(matrixSize / 2 - j, k);
				matrix.set(matrixSize / 2 + j, k);
				matrix.set(k, matrixSize / 2 - j);
				matrix.set(k, matrixSize / 2 + j);
			}
		}
	}
	return output;
}